

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O1

void set_reference_points
               (IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,TreesIndexer *indexer,
               bool with_distances,double *numeric_data,int *categ_data,bool is_col_major,
               size_t ld_numeric,size_t ld_categ,double *Xc,int *Xc_ind,int *Xc_indptr,double *Xr,
               int *Xr_ind,int *Xr_indptr,size_t nrows,int nthreads)

{
  if (model_outputs == (IsoForest *)0x0) {
    set_reference_points<ExtIsoForest,double,int>
              (indexer,model_outputs_ext,with_distances,numeric_data,categ_data,is_col_major,
               ld_numeric,ld_categ,Xc,Xc_ind,Xc_indptr,Xr,Xr_ind,Xr_indptr,nrows,nthreads);
  }
  else {
    set_reference_points<IsoForest,double,int>
              (indexer,model_outputs,with_distances,numeric_data,categ_data,is_col_major,ld_numeric,
               ld_categ,Xc,Xc_ind,Xc_indptr,Xr,Xr_ind,Xr_indptr,nrows,nthreads);
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void set_reference_points(IsoForest *model_outputs, ExtIsoForest *model_outputs_ext, TreesIndexer *indexer,
                          const bool with_distances,
                          real_t *numeric_data, int *categ_data,
                          bool is_col_major, size_t ld_numeric, size_t ld_categ,
                          real_t *Xc, sparse_ix *Xc_ind, sparse_ix *Xc_indptr,
                          real_t *Xr, sparse_ix *Xr_ind, sparse_ix *Xr_indptr,
                          size_t nrows, int nthreads)
{
    set_reference_points<real_t, sparse_ix>
                        (model_outputs, model_outputs_ext, indexer,
                         with_distances,
                         numeric_data, categ_data,
                         is_col_major, ld_numeric, ld_categ,
                         Xc, Xc_ind, Xc_indptr,
                         Xr, Xr_ind, Xr_indptr,
                         nrows, nthreads);
}